

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

string * __thiscall
FilenameBuilder::build
          (string *__return_storage_ptr__,FilenameBuilder *this,string *pattern,string *extension)

{
  tm *__tp;
  size_t sVar1;
  _Any_data *this_00;
  array<char,_128UL> tsbuf;
  allocator local_f9;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  string local_d8;
  _Any_data local_b8 [8];
  __time_t local_38;
  __syscall_slong_t _Stack_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pattern);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  if ((this->dir)._M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   "./",__return_storage_ptr__);
    this_00 = local_b8;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00->_M_pod_data)
    ;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   &this->dir,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   __return_storage_ptr__);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)local_b8[0]._M_pod_data);
    std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
    this_00 = &local_f8;
  }
  std::__cxx11::string::~string((string *)this_00->_M_pod_data);
  if (extension->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   __return_storage_ptr__,".");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   extension);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)local_b8[0]._M_pod_data);
    std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
    std::__cxx11::string::~string((string *)local_f8._M_pod_data);
  }
  std::__cxx11::string::string((string *)local_f8._M_pod_data,"%t",&local_f9);
  local_38 = (this->time).tv_sec;
  _Stack_30 = (this->time).tv_nsec;
  __tp = gmtime(&local_38);
  sVar1 = strftime(local_b8[0]._M_pod_data,0x80,"%Y%m%d-%H%M%S",__tp);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,local_b8,(long)local_b8 + sVar1);
  anon_unknown.dwarf_56160::replace(__return_storage_ptr__,(string *)&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)local_f8._M_pod_data);
  std::__cxx11::string::string
            ((string *)local_b8[0]._M_pod_data,"{filename}",(allocator *)local_f8._M_pod_data);
  anon_unknown.dwarf_56160::replace(__return_storage_ptr__,(string *)local_b8,&this->filename);
  std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
  std::__cxx11::string::string((string *)local_b8[0]._M_pod_data,"time",(allocator *)&local_d8);
  local_f8._M_unused._M_object = &this->time;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:91:24)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:91:24)>
             ::_M_manager;
  anon_unknown.dwarf_56160::replace(__return_storage_ptr__,(string *)local_b8,(subst *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
  std::__cxx11::string::string((string *)local_b8[0]._M_pod_data,"awips",(allocator *)&local_d8);
  local_f8._M_unused._M_object = &this->awips;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:64:25)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:64:25)>
             ::_M_manager;
  anon_unknown.dwarf_56160::replace(__return_storage_ptr__,(string *)local_b8,(subst *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
  std::__cxx11::string::string((string *)local_b8[0]._M_pod_data,"product",(allocator *)&local_d8);
  local_f8._M_unused._M_object = &this->product;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:103:27)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:103:27)>
             ::_M_manager;
  anon_unknown.dwarf_56160::replace(__return_storage_ptr__,(string *)local_b8,(subst *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
  std::__cxx11::string::string((string *)local_b8[0]._M_pod_data,"region",(allocator *)&local_d8);
  local_f8._M_unused._M_object = &this->region;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:114:26)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:114:26)>
             ::_M_manager;
  anon_unknown.dwarf_56160::replace(__return_storage_ptr__,(string *)local_b8,(subst *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
  std::__cxx11::string::string((string *)local_b8[0]._M_pod_data,"channel",(allocator *)&local_d8);
  local_f8._M_unused._M_object = &this->channel;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:125:27)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:125:27)>
             ::_M_manager;
  anon_unknown.dwarf_56160::replace(__return_storage_ptr__,(string *)local_b8,(subst *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::__cxx11::string::~string((string *)local_b8[0]._M_pod_data);
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameBuilder::build(
    const std::string& pattern,
    const std::string extension) const {
  std::string out = pattern;

  // Default pattern to passing through the original filename
  if (out.empty()) {
    out = "{filename}";
  }

  // Prefix directory if set
  if (!dir.empty()) {
    out = dir + "/" + out;
  } else {
    out = "./" + out;
  }

  // Append extension if set
  if (!extension.empty()) {
    out = out + "." + extension;
  }

  // %t: Date and time (ISO 8601)
  replace(out, "%t", toISO8601(time));

  // Replace {filename}
  replace(out, "{filename}", filename);

  // Replace {time:FORMAT}
  replace(out, time);

  // Replace {awips:XXX}
  replace(out, awips);

  // Replace {product:XXX}
  replace(out, product);

  // Replace {region:XXX}
  replace(out, region);

  // Replace {channel:XXX}
  replace(out, channel);

  return out;
}